

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emu2413.c
# Opt level: O0

void ym2413_update_emu(void *chip,UINT32 samples,DEV_SMPL **out)

{
  uint local_34;
  DEV_SMPL local_30;
  uint32_t i;
  int32_t buffers [2];
  EOPLL *opll;
  DEV_SMPL **out_local;
  UINT32 samples_local;
  void *chip_local;
  
  buffers = (int32_t  [2])chip;
  for (local_34 = 0; local_34 < samples; local_34 = local_34 + 1) {
    EOPLL_calcStereo((EOPLL *)buffers,&local_30);
    (*out)[local_34] = local_30;
    out[1][local_34] = i;
  }
  return;
}

Assistant:

static void ym2413_update_emu(void *chip, UINT32 samples, DEV_SMPL **out)
{
	EOPLL *opll = (EOPLL *)chip;
	int32_t buffers[2];
	uint32_t i;
	
	for (i=0; i < samples; i++)
	{
		EOPLL_calcStereo(opll, buffers);
		out[0][i] = buffers[0];
		out[1][i] = buffers[1];
	}
	
	return;
}